

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O0

ostream * pstack::operator<<(ostream *os,JSON<Elf64_Rela,_char> *rela)

{
  JObject *pJVar1;
  ostream *poVar2;
  char local_59;
  ulong local_58;
  char local_49;
  ulong local_48 [3];
  char local_29;
  JObject local_28;
  JSON<Elf64_Rela,_char> *local_18;
  JSON<Elf64_Rela,_char> *rela_local;
  ostream *os_local;
  
  local_18 = rela;
  rela_local = (JSON<Elf64_Rela,_char> *)os;
  JObject::JObject(&local_28,os);
  local_29 = '\0';
  pJVar1 = JObject::field<char[9],unsigned_long,char>
                     (&local_28,(char (*) [9])"r_offset",&local_18->object->r_offset,&local_29);
  local_48[0] = (ulong)*(uint *)((long)&local_18->object->r_info + 4);
  local_49 = '\0';
  pJVar1 = JObject::field<char[11],unsigned_long,char>
                     (pJVar1,(char (*) [11])"r_info-sym",local_48,&local_49);
  local_58 = (ulong)(uint)local_18->object->r_info;
  local_59 = '\0';
  pJVar1 = JObject::field<char[12],unsigned_long,char>
                     (pJVar1,(char (*) [12])"r_info-type",&local_58,&local_59);
  poVar2 = JObject::operator_cast_to_ostream_(pJVar1);
  JObject::~JObject(&local_28);
  return poVar2;
}

Assistant:

std::ostream &
operator <<(std::ostream &os, const JSON<Elf::Rela> &rela)
{
   return JObject(os)
      .field("r_offset", rela.object.r_offset)
      .field("r_info-sym", ELF_R_SYM(rela.object.r_info))
      .field("r_info-type", ELF_R_TYPE(rela.object.r_info));
}